

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

int Abc_NtkFinSimOneBit(Abc_Obj_t *pObj,int Type,Vec_Wrd_t *vSims,int nWords,int iBit)

{
  Abc_Ntk_t *pAVar1;
  Mio_Library_t *pLib;
  int iVar2;
  uint uVar3;
  word *pwVar4;
  word *pwVar5;
  Mio_Gate_t *pGate;
  int iVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  int iBits [6];
  
  pAVar1 = pObj->pNtk;
  iVar2 = iBit >> 5;
  if (((pAVar1->ntkFunc == ABC_FUNC_MAP) && (-1 < Type)) && (pAVar1->ntkType == ABC_NTK_LOGIC)) {
    pLib = (Mio_Library_t *)pAVar1->pManFunc;
    for (lVar7 = 0; lVar7 < (pObj->vFanins).nSize; lVar7 = lVar7 + 1) {
      pwVar4 = Vec_WrdEntryP(vSims,(pObj->vFanins).pArray[lVar7] * nWords);
      iBits[lVar7] = (uint)((*(uint *)((long)pwVar4 + (long)iVar2 * 4) >> (iBit & 0x1fU) & 1) != 0);
    }
    pGate = Mio_LibraryReadGateById(pLib,Type);
    iVar2 = Mio_LibGateSimulateOne(pGate,iBits);
    return iVar2;
  }
  uVar8 = 0xffffffff;
  uVar3 = uVar8;
  if (0 < (pObj->vFanins).nSize) {
    pwVar4 = Vec_WrdEntryP(vSims,*(pObj->vFanins).pArray * nWords);
    iVar6 = (pObj->vFanins).nSize;
    if (iVar6 < 2) {
      pwVar5 = (word *)0x0;
    }
    else {
      pwVar5 = Vec_WrdEntryP(vSims,nWords * (pObj->vFanins).pArray[1]);
      iVar6 = (pObj->vFanins).nSize;
    }
    if (0 < iVar6) {
      uVar3 = (uint)((*(uint *)((long)pwVar4 + (long)iVar2 * 4) >> (iBit & 0x1fU) & 1) != 0);
      if (iVar6 != 1) {
        uVar8 = (uint)((*(uint *)((long)pwVar5 + (long)iVar2 * 4) >> (iBit & 0x1fU) & 1) != 0);
      }
    }
  }
  switch(Type) {
  case -99:
    uVar3 = 0;
    break;
  case -0x62:
    uVar3 = 1;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDetect.c"
                  ,0x2a5,"int Abc_NtkFinSimOneBit(Abc_Obj_t *, int, Vec_Wrd_t *, int, int)");
  case -0x60:
    uVar3 = uVar3 & uVar8;
    break;
  case -0x5f:
    bVar9 = (uVar8 & uVar3) == 0;
    goto LAB_00279d40;
  case -0x5e:
    uVar3 = uVar3 | uVar8;
    break;
  case -0x5d:
    bVar9 = uVar8 == 0 && uVar3 == 0;
    goto LAB_00279d40;
  case -0x5c:
    uVar3 = uVar3 ^ uVar8;
    break;
  case -0x5b:
    bVar9 = uVar3 == uVar8;
    goto LAB_00279d40;
  case -0x5a:
    bVar9 = uVar3 == 0;
LAB_00279d40:
    uVar3 = (uint)bVar9;
    break;
  case -0x59:
    break;
  }
  return uVar3;
}

Assistant:

static inline int Abc_NtkFinSimOneBit( Abc_Obj_t * pObj, int Type, Vec_Wrd_t * vSims, int nWords, int iBit )
{
    if ( Abc_NtkIsMappedLogic(pObj->pNtk) && Type >= 0 )
    {
        extern int Mio_LibGateSimulateOne( Mio_Gate_t * pGate, int iBits[6] );
        Mio_Library_t * pLib = (Mio_Library_t *)pObj->pNtk->pManFunc;
        int i, iBits[6];
        for ( i = 0; i < Abc_ObjFaninNum(pObj); i++ )
        {
            word * pSim0 = Vec_WrdEntryP( vSims, nWords * Abc_ObjFaninId(pObj, i) );
            iBits[i] = Abc_InfoHasBit( (unsigned*)pSim0, iBit );
        }
        return Mio_LibGateSimulateOne( Mio_LibraryReadGateById(pLib, Type), iBits );
    }
    else
    {
        word * pSim0 = Abc_ObjFaninNum(pObj) > 0 ? Vec_WrdEntryP( vSims, nWords * Abc_ObjFaninId0(pObj) ) : NULL;
        word * pSim1 = Abc_ObjFaninNum(pObj) > 1 ? Vec_WrdEntryP( vSims, nWords * Abc_ObjFaninId1(pObj) ) : NULL;
        int iBit0 = Abc_ObjFaninNum(pObj) > 0 ? Abc_InfoHasBit( (unsigned*)pSim0, iBit ) : -1;
        int iBit1 = Abc_ObjFaninNum(pObj) > 1 ? Abc_InfoHasBit( (unsigned*)pSim1, iBit ) : -1;
        assert( Type != ABC_FIN_NEG );
        if ( Type == ABC_FIN_SA0 )            return 0;
        if ( Type == ABC_FIN_SA1 )            return 1;
        if ( Type == ABC_FIN_RDOB_BUFF )      return iBit0;
        if ( Type == ABC_FIN_RDOB_NOT )       return !iBit0;
        if ( Type == ABC_FIN_RDOB_AND )       return iBit0 & iBit1;
        if ( Type == ABC_FIN_RDOB_OR )        return iBit0 | iBit1;
        if ( Type == ABC_FIN_RDOB_XOR )       return iBit0 ^ iBit1;
        if ( Type == ABC_FIN_RDOB_NAND )      return !(iBit0 & iBit1);
        if ( Type == ABC_FIN_RDOB_NOR )       return !(iBit0 | iBit1);
        if ( Type == ABC_FIN_RDOB_NXOR )      return !(iBit0 ^ iBit1);
        assert( 0 );
        return -1;
    }
}